

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::draw
          (PrimitiveRestartCase *this,int startNdx,int count)

{
  IndexType IVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  void *pvVar5;
  uint uVar6;
  GLenum mode;
  deUint32 dVar7;
  GLenum type;
  int indexNdx;
  
  uVar2 = this->m_primType - PRIMITIVE_LINE_STRIP;
  mode = 0;
  if (uVar2 < 6) {
    mode = *(GLenum *)(&DAT_0184e664 + (ulong)uVar2 * 4);
  }
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    dVar7 = 0xff;
    type = 0x1401;
  }
  else {
    if (IVar1 == INDEX_UNSIGNED_INT) {
      type = 0x1405;
    }
    else {
      if (IVar1 == INDEX_UNSIGNED_SHORT) {
        dVar7 = 0xffff;
        type = 0x1403;
        goto LAB_0105ef25;
      }
      type = 0;
    }
    dVar7 = -(uint)(IVar1 == INDEX_UNSIGNED_INT);
  }
LAB_0105ef25:
  if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
    pvVar5 = getIndexPtr(this,startNdx);
    glwDrawElementsInstanced(mode,count,type,pvVar5,1);
    return;
  }
  if (this->m_function == FUNCTION_DRAW_ELEMENTS) {
    pvVar5 = getIndexPtr(this,startNdx);
    glwDrawElements(mode,count,type,pvVar5);
    return;
  }
  iVar3 = getNumIndices(this);
  uVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (indexNdx = 0; iVar3 != indexNdx; indexNdx = indexNdx + 1) {
    dVar4 = getIndex(this,indexNdx);
    uVar6 = uVar2;
    if (uVar2 < dVar4) {
      uVar6 = dVar4;
    }
    if (dVar4 != dVar7) {
      uVar2 = uVar6;
    }
  }
  pvVar5 = getIndexPtr(this,startNdx);
  glwDrawRangeElements(mode,0,uVar2,count,type,pvVar5);
  return;
}

Assistant:

void PrimitiveRestartCase::draw (int startNdx, int count)
{
	GLenum primTypeGL;

	switch (m_primType)
	{
		case PRIMITIVE_POINTS:			primTypeGL = GL_POINTS;			break;
		case PRIMITIVE_LINE_STRIP:		primTypeGL = GL_LINE_STRIP;		break;
		case PRIMITIVE_LINE_LOOP:		primTypeGL = GL_LINE_LOOP;		break;
		case PRIMITIVE_LINES:			primTypeGL = GL_LINES;			break;
		case PRIMITIVE_TRIANGLE_STRIP:	primTypeGL = GL_TRIANGLE_STRIP;	break;
		case PRIMITIVE_TRIANGLE_FAN:	primTypeGL = GL_TRIANGLE_FAN;	break;
		case PRIMITIVE_TRIANGLES:		primTypeGL = GL_TRIANGLES;		break;
		default:
			DE_ASSERT(DE_FALSE);
			primTypeGL = 0;
	}

	GLenum indexTypeGL;

	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	indexTypeGL = GL_UNSIGNED_BYTE;		break;
		case INDEX_UNSIGNED_SHORT:	indexTypeGL = GL_UNSIGNED_SHORT;	break;
		case INDEX_UNSIGNED_INT:	indexTypeGL = GL_UNSIGNED_INT;		break;
		default:
			DE_ASSERT(DE_FALSE);
			indexTypeGL = 0;
	}

	deUint32 restartIndex = m_indexType == INDEX_UNSIGNED_BYTE	? RESTART_INDEX_UNSIGNED_BYTE
						  : m_indexType == INDEX_UNSIGNED_SHORT	? RESTART_INDEX_UNSIGNED_SHORT
						  : m_indexType == INDEX_UNSIGNED_INT	? RESTART_INDEX_UNSIGNED_INT
						  : 0;

	DE_ASSERT(restartIndex != 0);

	if (m_function == FUNCTION_DRAW_ELEMENTS)
		glDrawElements(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	else if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
		glDrawElementsInstanced(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx), 1);
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_RANGE_ELEMENTS);

		// Find the largest non-restart index in the index array (for glDrawRangeElements() end parameter).

		deUint32 max = 0;

		int numIndices = getNumIndices();
		for (int i = 0; i < numIndices; i++)
		{
			deUint32 index = getIndex(i);
			if (index != restartIndex && index > max)
				max = index;
		}

		glDrawRangeElements(primTypeGL, 0, (GLuint)max, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	}
}